

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer-shared.cpp
# Opt level: O2

Ref makeSigning(Ref node,JsSign sign)

{
  size_t sVar1;
  Ref RVar2;
  Ref RVar3;
  undefined8 *puVar4;
  size_t *psVar5;
  Ref in_R8;
  IString op;
  
  if (sign - JS_SIGNED < 2) {
    puVar4 = &cashew::TRSHIFT;
    psVar5 = &DAT_011753b0;
    if (sign == JS_SIGNED) {
      puVar4 = &cashew::OR;
    }
    RVar3.inst = (Value *)*puVar4;
    if (sign == JS_SIGNED) {
      psVar5 = &DAT_011752b0;
    }
    sVar1 = *psVar5;
    RVar2 = cashew::ValueBuilder::makeDouble(0.0);
    op.str._M_str = (char *)RVar2.inst;
    op.str._M_len = sVar1;
    RVar3 = cashew::ValueBuilder::makeBinary(node.inst,RVar3,op,in_R8);
    return (Ref)RVar3.inst;
  }
  __assert_fail("sign == JS_SIGNED || sign == JS_UNSIGNED",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/optimizer-shared.cpp"
                ,0x88,"Ref makeSigning(Ref, JsSign)");
}

Assistant:

Ref makeSigning(Ref node, JsSign sign) {
  assert(sign == JS_SIGNED || sign == JS_UNSIGNED);
  return ValueBuilder::makeBinary(
    node, sign == JS_SIGNED ? OR : TRSHIFT, ValueBuilder::makeNum(0));
}